

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_library.cpp
# Opt level: O2

void __thiscall Omega_h::Library::initialize(Library *this,char *head_desc,int *argc,char ***argv)

{
  CommPtr *this_00;
  pointer *ppuVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Comm *pCVar5;
  CmdLineFlag *pCVar6;
  History *pHVar7;
  ostream *poVar8;
  int ic;
  long lVar9;
  allocator local_25d;
  uint local_25c;
  string msg_str;
  string local_238;
  char local_211;
  char ***local_210;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_208;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_1f8;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_1e8;
  string lib_desc;
  CmdLine cmdline;
  
  local_210 = argv;
  std::__cxx11::string::string
            ((string *)&lib_desc,"9.34.13-sha.dc235450+00000010000000001",(allocator *)&cmdline);
  bVar2 = std::operator!=(&lib_desc,head_desc);
  if (bVar2) {
    std::__cxx11::stringstream::stringstream((stringstream *)&cmdline);
    ppuVar1 = &cmdline.args_.
               super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::operator<<((ostream *)ppuVar1,"omega_h description string mismatch.\n");
    poVar8 = std::operator<<((ostream *)ppuVar1,"header says: ");
    poVar8 = std::operator<<(poVar8,head_desc);
    std::operator<<(poVar8,'\n');
    poVar8 = std::operator<<((ostream *)ppuVar1,"library says: ");
    poVar8 = std::operator<<(poVar8,(string *)&lib_desc);
    std::operator<<(poVar8,'\n');
    std::__cxx11::stringbuf::str();
    fail("%s\n",CONCAT44(msg_str._M_dataplus._M_p._4_4_,(uint)msg_str._M_dataplus._M_p));
  }
  local_211 = local_210 != (char ***)0x0 && argc != (int *)0x0;
  if (local_210 != (char ***)0x0 && argc != (int *)0x0) {
    for (lVar9 = 0; lVar9 < *argc; lVar9 = lVar9 + 1) {
      std::__cxx11::string::string((string *)&cmdline,(*local_210)[lVar9],(allocator *)&msg_str);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->argv_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cmdline);
      std::__cxx11::string::~string((string *)&cmdline);
    }
  }
  pCVar5 = (Comm *)operator_new(0x50);
  Comm::Comm(pCVar5,this,false,false);
  std::__shared_ptr<Omega_h::Comm,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Omega_h::Comm,void>
            ((__shared_ptr<Omega_h::Comm,(__gnu_cxx::_Lock_policy)2> *)&cmdline,pCVar5);
  this_00 = &this->world_;
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)&cmdline);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &cmdline.args_.
              super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  pCVar5 = (Comm *)operator_new(0x50);
  Comm::Comm(pCVar5,this,false,false);
  std::__shared_ptr<Omega_h::Comm,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Omega_h::Comm,void>
            ((__shared_ptr<Omega_h::Comm,(__gnu_cxx::_Lock_policy)2> *)&cmdline,pCVar5);
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->self_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)&cmdline);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &cmdline.args_.
              super__Vector_base<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  CmdLine::CmdLine(&cmdline);
  std::__cxx11::string::string((string *)&msg_str,"--osh-memory",(allocator *)&local_25c);
  std::__cxx11::string::string
            ((string *)&local_238,"print amount and stacktrace of max memory use",&local_25d);
  CmdLine::add_flag(&cmdline,&msg_str,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&msg_str);
  std::__cxx11::string::string((string *)&msg_str,"--osh-time",(allocator *)&local_25c);
  std::__cxx11::string::string
            ((string *)&local_238,"print amount of time spend in certain functions",&local_25d);
  CmdLine::add_flag(&cmdline,&msg_str,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&msg_str);
  std::__cxx11::string::string((string *)&msg_str,"--osh-time-percent",(allocator *)&local_25c);
  std::__cxx11::string::string
            ((string *)&local_238,"print amount of time spend in certain functions by percentage",
             &local_25d);
  CmdLine::add_flag(&cmdline,&msg_str,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&msg_str);
  std::__cxx11::string::string((string *)&msg_str,"--osh-time-chop",(allocator *)&local_25c);
  std::__cxx11::string::string
            ((string *)&local_238,
             "only print functions whose percent time is greater than given value (e.g. --osh-time-chop=2)"
             ,&local_25d);
  pCVar6 = CmdLine::add_flag(&cmdline,&msg_str,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&msg_str);
  std::__cxx11::string::string((string *)&msg_str,"0.0",(allocator *)&local_25c);
  local_238._M_dataplus._M_p = (pointer)0x0;
  CmdLineFlag::add_arg<double>(pCVar6,&msg_str,(double *)&local_238);
  std::__cxx11::string::~string((string *)&msg_str);
  std::__cxx11::string::string
            ((string *)&msg_str,"--osh-time-with-filename",(allocator *)&local_25c);
  std::__cxx11::string::string
            ((string *)&local_238,"add file name to function name in profile output",&local_25d);
  CmdLine::add_flag(&cmdline,&msg_str,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&msg_str);
  std::__cxx11::string::string((string *)&msg_str,"--osh-signal",(allocator *)&local_25c);
  std::__cxx11::string::string
            ((string *)&local_238,"catch signals and print a stacktrace",&local_25d);
  CmdLine::add_flag(&cmdline,&msg_str,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&msg_str);
  std::__cxx11::string::string((string *)&msg_str,"--osh-fpe",(allocator *)&local_25c);
  std::__cxx11::string::string((string *)&local_238,"enable floating-point exceptions",&local_25d);
  CmdLine::add_flag(&cmdline,&msg_str,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&msg_str);
  std::__cxx11::string::string((string *)&msg_str,"--osh-silent",(allocator *)&local_25c);
  std::__cxx11::string::string((string *)&local_238,"suppress all output",&local_25d);
  CmdLine::add_flag(&cmdline,&msg_str,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&msg_str);
  std::__cxx11::string::string((string *)&msg_str,"--osh-pool",(allocator *)&local_25c);
  std::__cxx11::string::string((string *)&local_238,"use memory pooling",&local_25d);
  CmdLine::add_flag(&cmdline,&msg_str,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&msg_str);
  std::__cxx11::string::string((string *)&msg_str,"--osh-self-send",(allocator *)&local_25c);
  std::__cxx11::string::string((string *)&local_238,"control self send threshold",&local_25d);
  pCVar6 = CmdLine::add_flag(&cmdline,&msg_str,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&msg_str);
  std::__cxx11::string::string((string *)&msg_str,"value",(allocator *)&local_25c);
  local_238._M_dataplus._M_p = local_238._M_dataplus._M_p & 0xffffffff00000000;
  CmdLineFlag::add_arg<int>(pCVar6,&msg_str,(int *)&local_238);
  std::__cxx11::string::~string((string *)&msg_str);
  std::__cxx11::string::string
            ((string *)&msg_str,"--osh-mpi-ranks-per-node",(allocator *)&local_25c);
  std::__cxx11::string::string((string *)&local_238,"mpi ranks per node (for CUDA+MPI)",&local_25d);
  pCVar6 = CmdLine::add_flag(&cmdline,&msg_str,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&msg_str);
  std::__cxx11::string::string((string *)&msg_str,"value",(allocator *)&local_25c);
  local_238._M_dataplus._M_p = local_238._M_dataplus._M_p & 0xffffffff00000000;
  CmdLineFlag::add_arg<int>(pCVar6,&msg_str,(int *)&local_238);
  std::__cxx11::string::~string((string *)&msg_str);
  if (local_211 != '\0') {
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1e8,&this_00->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
    bVar2 = CmdLine::parse(&cmdline,(CommPtr *)&local_1e8,argc,*local_210);
    if (!bVar2) {
      fail("assertion %s failed at %s +%d\n","cmdline.parse(world_, argc, *argv)",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_library.cpp"
           ,0x77);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
  }
  std::__cxx11::string::string
            ((string *)&msg_str,"--osh-time-with-filename",(allocator *)&local_238);
  bVar2 = CmdLine::parsed(&cmdline,&msg_str);
  std::__cxx11::string::~string((string *)&msg_str);
  std::__cxx11::string::string((string *)&msg_str,"--osh-time-chop",(allocator *)&local_25c);
  std::__cxx11::string::string((string *)&local_238,"0.0",&local_25d);
  local_210 = (char ***)CmdLine::get<double>(&cmdline,&msg_str,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&msg_str);
  std::__cxx11::string::string((string *)&msg_str,"--osh-time",(allocator *)&local_238);
  bVar3 = CmdLine::parsed(&cmdline,&msg_str);
  std::__cxx11::string::~string((string *)&msg_str);
  if (bVar3) {
    pHVar7 = (History *)operator_new(0x70);
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1f8,&this_00->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
    profile::History::History(pHVar7,(CommPtr *)&local_1f8,false,(double)local_210,bVar2);
    profile::global_singleton_history = pHVar7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8._M_refcount);
  }
  std::__cxx11::string::string((string *)&msg_str,"--osh-time-percent",(allocator *)&local_238);
  bVar3 = CmdLine::parsed(&cmdline,&msg_str);
  std::__cxx11::string::~string((string *)&msg_str);
  if (bVar3) {
    pHVar7 = (History *)operator_new(0x70);
    std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_208,&this_00->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
    profile::History::History(pHVar7,(CommPtr *)&local_208,true,(double)local_210,bVar2);
    profile::global_singleton_history = pHVar7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208._M_refcount);
  }
  std::__cxx11::string::string((string *)&msg_str,"--osh-fpe",(allocator *)&local_238);
  bVar2 = CmdLine::parsed(&cmdline,&msg_str);
  std::__cxx11::string::~string((string *)&msg_str);
  if (bVar2) {
    msg_str._M_dataplus._M_p._0_4_ = MXCSR;
    local_238._M_dataplus._M_p._0_4_ = MXCSR;
    MXCSR = MXCSR & 0xffffff7f;
    local_25c = MXCSR;
  }
  this->self_send_threshold_ = 1000000;
  std::__cxx11::string::string((string *)&msg_str,"--osh-self-send",(allocator *)&local_238);
  bVar2 = CmdLine::parsed(&cmdline,&msg_str);
  std::__cxx11::string::~string((string *)&msg_str);
  if (bVar2) {
    std::__cxx11::string::string((string *)&msg_str,"--osh-self-send",(allocator *)&local_25c);
    std::__cxx11::string::string((string *)&local_238,"value",&local_25d);
    iVar4 = CmdLine::get<int>(&cmdline,&msg_str,&local_238);
    this->self_send_threshold_ = iVar4;
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&msg_str);
  }
  std::__cxx11::string::string((string *)&msg_str,"--osh-silent",(allocator *)&local_238);
  bVar2 = CmdLine::parsed(&cmdline,&msg_str);
  this->silent_ = bVar2;
  std::__cxx11::string::~string((string *)&msg_str);
  std::__cxx11::string::string((string *)&msg_str,"--osh-signal",(allocator *)&local_238);
  bVar2 = CmdLine::parsed(&cmdline,&msg_str);
  std::__cxx11::string::~string((string *)&msg_str);
  if (bVar2) {
    protect();
  }
  std::__cxx11::string::string((string *)&msg_str,"--osh-pool",(allocator *)&local_238);
  bVar2 = CmdLine::parsed(&cmdline,&msg_str);
  std::__cxx11::string::~string((string *)&msg_str);
  if (bVar2) {
    enable_pooling();
  }
  CmdLine::~CmdLine(&cmdline);
  std::__cxx11::string::~string((string *)&lib_desc);
  return;
}

Assistant:

void Library::initialize(char const* head_desc, int* argc, char*** argv
#ifdef OMEGA_H_USE_MPI
    ,
    MPI_Comm comm_mpi
#endif
) {
  std::string lib_desc = OMEGA_H_SEMVER;
  if (lib_desc != head_desc) {
    std::stringstream msg;
    msg << "omega_h description string mismatch.\n";
    msg << "header says: " << head_desc << '\n';
    msg << "library says: " << lib_desc << '\n';
    std::string msg_str = msg.str();
    Omega_h::fail("%s\n", msg_str.c_str());
  }
  if (argc && argv) {
    for (int ic = 0; ic < *argc; ic++) {
      argv_.push_back((*argv)[ic]);
    }
  }
#ifdef OMEGA_H_USE_MPI
  int mpi_is_init;
  OMEGA_H_CHECK(MPI_SUCCESS == MPI_Initialized(&mpi_is_init));
  if (!mpi_is_init) {
    OMEGA_H_CHECK(MPI_SUCCESS == MPI_Init(argc, argv));
    we_called_mpi_init = true;
  } else {
    we_called_mpi_init = false;
  }
  MPI_Comm world_dup;
  MPI_Comm_dup(comm_mpi, &world_dup);
  world_ = CommPtr(new Comm(this, world_dup));

#ifdef OMEGA_H_DBG
  DBG_COMM = world_.get();
#endif

#else
  world_ = CommPtr(new Comm(this, false, false));
  self_ = CommPtr(new Comm(this, false, false));
#endif
  Omega_h::CmdLine cmdline;
  cmdline.add_flag(
      "--osh-memory", "print amount and stacktrace of max memory use");
  cmdline.add_flag(
      "--osh-time", "print amount of time spend in certain functions");
  cmdline.add_flag(
      "--osh-time-percent", "print amount of time spend in certain functions by percentage");
  auto& osh_time_chop_flag = cmdline.add_flag(
      "--osh-time-chop", "only print functions whose percent time is greater than given value (e.g. --osh-time-chop=2)");
  osh_time_chop_flag.add_arg<double>("0.0");
  cmdline.add_flag("--osh-time-with-filename", "add file name to function name in profile output");

  cmdline.add_flag("--osh-signal", "catch signals and print a stacktrace");
  cmdline.add_flag("--osh-fpe", "enable floating-point exceptions");
  cmdline.add_flag("--osh-silent", "suppress all output");
  cmdline.add_flag("--osh-pool", "use memory pooling");
  auto& self_send_flag =
      cmdline.add_flag("--osh-self-send", "control self send threshold");
  self_send_flag.add_arg<int>("value");
  auto& mpi_ranks_flag =
      cmdline.add_flag("--osh-mpi-ranks-per-node", "mpi ranks per node (for CUDA+MPI)");
  mpi_ranks_flag.add_arg<int>("value");
  if (argc && argv) {
    OMEGA_H_CHECK(cmdline.parse(world_, argc, *argv));
  }
  bool add_filename = false;
  if (cmdline.parsed("--osh-time-with-filename")) {
    add_filename = true;
  }
  double chop = cmdline.get<double>("--osh-time-chop", "0.0");
  if (cmdline.parsed("--osh-time")) {
    Omega_h::profile::global_singleton_history =
      new Omega_h::profile::History(world_, false, chop, add_filename);
  }
  if (cmdline.parsed("--osh-time-percent")) {
    Omega_h::profile::global_singleton_history =
      new Omega_h::profile::History(world_, true, chop, add_filename);
  }
  if (cmdline.parsed("--osh-fpe")) {
    enable_floating_point_exceptions();
  }
  self_send_threshold_ = 1000 * 1000;
  if (cmdline.parsed("--osh-self-send")) {
    self_send_threshold_ = cmdline.get<int>("--osh-self-send", "value");
  }
  silent_ = cmdline.parsed("--osh-silent");
#ifdef OMEGA_H_USE_KOKKOS
  if (!Kokkos::is_initialized()) {
    OMEGA_H_CHECK(argc != nullptr);
    OMEGA_H_CHECK(argv != nullptr);
    Kokkos::initialize(*argc, *argv);
    we_called_kokkos_init = true;
  } else {
    we_called_kokkos_init = false;
  }
#endif
#if defined(OMEGA_H_USE_CUDA) && defined(OMEGA_H_USE_MPI) \
  && (!defined(OMEGA_H_USE_KOKKOS))
  if (cmdline.parsed("--osh-mpi-ranks-per-node")) {
    int rank, ndevices_per_node, my_device;
    MPI_Comm_rank(MPI_COMM_WORLD, &rank);
    cudaGetDeviceCount(&ndevices_per_node);
    int mpi_ranks_per_node =
      cmdline.get<int>("--osh-mpi-ranks-per-node", "value");
    int local_mpi_rank = rank % mpi_ranks_per_node;
    cudaSetDevice(local_mpi_rank);
    cudaGetDevice(&my_device);
    PCOUT("ndevices_per_node= " << ndevices_per_node << " mpi_ranks_per_node= " << mpi_ranks_per_node << " local_mpi_rank= " << local_mpi_rank << std::endl);
    OMEGA_H_CHECK_OP(mpi_ranks_per_node, ==, ndevices_per_node);
    OMEGA_H_CHECK_OP(my_device, ==, local_mpi_rank);
  }
#endif
  if (cmdline.parsed("--osh-signal")) Omega_h::protect();
#if defined(OMEGA_H_USE_CUDA) && (!defined(OMEGA_H_USE_KOKKOS))
  // trigger lazy initialization of the CUDA runtime
  // and prevent it from polluting later timings
  cudaFree(nullptr);
#endif
  if (cmdline.parsed("--osh-pool")) enable_pooling();
}